

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O0

void __thiscall
Diligent::TextureBaseGL::TextureBaseGL
          (TextureBaseGL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          GLContextState *GLState,TextureDesc *TexDesc,GLuint GLTextureHandle,GLenum BindTarget,
          bool bIsDeviceInternal)

{
  GLenum GVar1;
  RenderDeviceInfo *pRVar2;
  GLTextureCreateReleaseHelper local_ec;
  Char *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  DepthStencilClearValue local_a8;
  Uint64 UStack_a0;
  TextureDesc local_90;
  byte local_39;
  TextureDesc *pTStack_38;
  bool bIsDeviceInternal_local;
  TextureDesc *TexDesc_local;
  GLContextState *GLState_local;
  RenderDeviceGLImpl *pDeviceGL_local;
  FixedBlockMemoryAllocator *TexViewObjAllocator_local;
  IReferenceCounters *pRefCounters_local;
  TextureBaseGL *this_local;
  
  local_39 = bIsDeviceInternal;
  pTStack_38 = TexDesc;
  TexDesc_local = (TextureDesc *)GLState;
  GLState_local = (GLContextState *)pDeviceGL;
  pDeviceGL_local = (RenderDeviceGLImpl *)TexViewObjAllocator;
  TexViewObjAllocator_local = (FixedBlockMemoryAllocator *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  pRVar2 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetDeviceInfo
                     (&pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
  local_a8 = (pTStack_38->ClearValue).DepthStencil;
  UStack_a0 = pTStack_38->ImmediateContextMask;
  local_e8 = (pTStack_38->super_DeviceObjectAttribs).Name;
  uStack_e0._0_1_ = pTStack_38->Type;
  uStack_e0._1_3_ = *(undefined3 *)&pTStack_38->field_0x9;
  uStack_e0._4_4_ = pTStack_38->Width;
  local_d8._0_4_ = pTStack_38->Height;
  local_d8._4_4_ = pTStack_38->field_3;
  uStack_d0._0_2_ = pTStack_38->Format;
  uStack_d0._2_2_ = *(undefined2 *)&pTStack_38->field_0x1a;
  uStack_d0._4_4_ = pTStack_38->MipLevels;
  local_c8._0_4_ = pTStack_38->SampleCount;
  local_c8._4_4_ = pTStack_38->BindFlags;
  uStack_c0._0_1_ = pTStack_38->Usage;
  uStack_c0._1_1_ = pTStack_38->CPUAccessFlags;
  uStack_c0._2_1_ = pTStack_38->MiscFlags;
  uStack_c0._3_1_ = pTStack_38->field_0x2b;
  uStack_c0._4_2_ = (pTStack_38->ClearValue).Format;
  uStack_c0._6_2_ = *(undefined2 *)&(pTStack_38->ClearValue).field_0x2;
  local_b8 = *(undefined8 *)(pTStack_38->ClearValue).Color;
  uStack_b0 = *(undefined8 *)((pTStack_38->ClearValue).Color + 2);
  GetTextureDescFromGLHandle
            (&local_90,pRVar2,(GLContextState *)TexDesc_local,*pTStack_38,GLTextureHandle,BindTarget
            );
  TextureBase<Diligent::EngineGLImplTraits>::TextureBase
            (&this->super_TextureBase<Diligent::EngineGLImplTraits>,pRefCounters,TexViewObjAllocator
             ,pDeviceGL,&local_90,(bool)(local_39 & 1));
  AsyncWritableResource::AsyncWritableResource(&this->super_AsyncWritableResource);
  (this->super_TextureBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00592fe8;
  GLObjectWrappers::GLTextureCreateReleaseHelper::GLTextureCreateReleaseHelper
            (&local_ec,GLTextureHandle);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
            (&this->m_GlTexture,true,local_ec);
  RefCntAutoPtr<Diligent::IBuffer>::RefCntAutoPtr(&this->m_pPBO);
  this->m_BindTarget = BindTarget;
  pRVar2 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetDeviceInfo
                     ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)GLState_local);
  GVar1 = GetTextureInternalFormat
                    (pRVar2,(GLContextState *)TexDesc_local,BindTarget,&this->m_GlTexture,
                     pTStack_38->Format);
  this->m_GLTexFormat = GVar1;
  return;
}

Assistant:

TextureBaseGL::TextureBaseGL(IReferenceCounters*        pRefCounters,
                             FixedBlockMemoryAllocator& TexViewObjAllocator,
                             RenderDeviceGLImpl*        pDeviceGL,
                             GLContextState&            GLState,
                             const TextureDesc&         TexDesc,
                             GLuint                     GLTextureHandle,
                             GLenum                     BindTarget,
                             bool                       bIsDeviceInternal /* = false*/) :
    // clang-format off
    TTextureBase
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        GetTextureDescFromGLHandle(pDeviceGL->GetDeviceInfo(), GLState, TexDesc, GLTextureHandle, BindTarget),
        bIsDeviceInternal
    },
    // Create texture object wrapper, but use external texture handle
    m_GlTexture     {true, GLObjectWrappers::GLTextureCreateReleaseHelper(GLTextureHandle)},
    m_BindTarget    {BindTarget},
    m_GLTexFormat   {GetTextureInternalFormat(pDeviceGL->GetDeviceInfo(), GLState, BindTarget, m_GlTexture, TexDesc.Format)}
// clang-format on
{
}